

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void gmath::Distortion::cleanAllProperties(Properties *prop,int id)

{
  RadialTangentialDistortion *this;
  RadialDistortion rd;
  EquidistantDistortion ed;
  RadialTangentialDistortion rtd;
  
  EquidistantDistortion::EquidistantDistortion(&ed);
  RadialTangentialDistortion::RadialTangentialDistortion(&rtd,3);
  this = (RadialTangentialDistortion *)&rd;
  RadialDistortion::RadialDistortion((RadialDistortion *)this,3);
  EquidistantDistortion::cleanProperties((EquidistantDistortion *)this,prop,id);
  RadialTangentialDistortion::cleanProperties(this,prop,id);
  RadialDistortion::cleanProperties((RadialDistortion *)this,prop,id);
  return;
}

Assistant:

void Distortion::cleanAllProperties(gutil::Properties &prop, int id)
{
  EquidistantDistortion ed;
  RadialTangentialDistortion rtd(3);
  RadialDistortion rd(3);

  ed.cleanProperties(prop, id);
  rtd.cleanProperties(prop, id);
  rd.cleanProperties(prop, id);
}